

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O1

bool __thiscall
iDynTree::ModelLoader::loadReducedModelFromFullModel
          (ModelLoader *this,Model *fullModel,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredJoints,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *removedJointPositions,string param_4)

{
  _Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false> this_00;
  char cVar1;
  Model _modelReduced;
  Model aMStack_158 [304];
  
  iDynTree::Model::Model(aMStack_158);
  iDynTree::Model::getPackageDirs_abi_cxx11_();
  iDynTree::Model::setPackageDirs((vector *)aMStack_158);
  cVar1 = iDynTree::createReducedModel
                    (fullModel,(vector *)consideredJoints,aMStack_158,
                     (unordered_map *)removedJointPositions);
  if (cVar1 != '\0') {
    this_00._M_head_impl =
         (this->m_pimpl)._M_t.
         super___uniq_ptr_impl<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
         ._M_t.
         super__Tuple_impl<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
         .super__Head_base<0UL,_iDynTree::ModelLoader::ModelLoaderPimpl_*,_false>._M_head_impl;
    iDynTree::Model::operator=(&(this_00._M_head_impl)->m_model,aMStack_158);
    *(Model *)&(this_00._M_head_impl)->m_isModelValid = (Model)0x1;
  }
  iDynTree::Model::~Model(aMStack_158);
  return (bool)cVar1;
}

Assistant:

bool ModelLoader::loadReducedModelFromFullModel(const Model& fullModel,
                                                    const std::vector< std::string >& consideredJoints,
                                                    const std::unordered_map<std::string, double>& removedJointPositions,
                                                    const std::string /*filetype*/)
    {
        Model _modelReduced;
        _modelReduced.setPackageDirs(fullModel.getPackageDirs());
        bool ok = createReducedModel(fullModel,consideredJoints,_modelReduced, removedJointPositions);

        if( !ok )
        {
            return false;
        }

        return m_pimpl->setModel(_modelReduced);
    }